

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  pointer pbVar1;
  string *psVar2;
  string *psVar3;
  bool bVar4;
  uint uVar5;
  cmUVProcessChainBuilder *pcVar6;
  size_t sVar7;
  uv_loop_t *puVar8;
  ulong uVar9;
  pointer pcVar10;
  Status *this_00;
  ostream *poVar11;
  string *a;
  pointer pbVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool timedOut;
  cmProcessOutput processOutput;
  bool errFinished;
  bool outFinished;
  cmUVProcessChain chain;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  uv_timer_ptr timer;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  uv_pipe_ptr errStream;
  uv_pipe_ptr outStream;
  anon_class_24_3_169f6e42 startRead;
  cmUVProcessChainBuilder builder;
  string strdata;
  cmProcessOutput local_3bb;
  byte local_3ba;
  char local_3b9;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [16];
  vector<char,_std::allocator<char>_> local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  long local_368;
  vector<char,_std::allocator<char>_> local_358;
  vector<char,_std::allocator<char>_> local_338;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  uv_handle_ptr_base_<uv_timer_s> local_2f8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_2e8;
  uv_handle_ptr_base_<uv_pipe_s> local_2c8;
  uv_handle_ptr_base_<uv_pipe_s> local_2b8;
  int *local_2a8;
  string *local_2a0;
  string *local_298;
  string local_290;
  uv_pipe_ptr local_270;
  cmProcessOutput *local_260;
  rep_conflict local_258;
  long *local_248;
  long local_238 [2];
  string local_228;
  cmUVProcessChainBuilder local_208;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8._8_8_ = this;
  local_2a8 = retVal;
  local_2a0 = stdOut;
  local_298 = stdErr;
  local_258 = timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_2e8,
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar1) {
    do {
      local_1a8._0_8_ = (pbVar12->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_2e8,(char **)local_1a8);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar1);
  }
  local_1a8._0_8_ = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_2e8,(char **)local_1a8);
  psVar3 = local_298;
  psVar2 = local_2a0;
  local_2a0->_M_string_length = 0;
  *(local_2a0->_M_dataplus)._M_p = '\0';
  local_298->_M_string_length = 0;
  *(local_298->_M_dataplus)._M_p = '\0';
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_208);
  pcVar6 = cmUVProcessChainBuilder::AddCommand(&local_208,args);
  pcVar6 = cmUVProcessChainBuilder::SetBuiltinStream(pcVar6,Stream_OUTPUT);
  cmUVProcessChainBuilder::SetBuiltinStream(pcVar6,Stream_ERROR);
  if (dir != (char *)0x0) {
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    sVar7 = strlen(dir);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,dir,dir + sVar7);
    cmUVProcessChainBuilder::SetWorkingDirectory(&local_208,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_3b8);
  local_2f8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2f8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((local_258 != 0.0) || (NAN(local_258))) {
    puVar8 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_3b8);
    ::cm::uv_timer_ptr::init((uv_timer_ptr *)&local_2f8,(EVP_PKEY_CTX *)puVar8);
    uVar9 = (ulong)(local_258 * 1000.0);
    ::cm::uv_timer_ptr::start
              ((uv_timer_ptr *)&local_2f8,RunCommand::anon_class_1_0_00000001::__invoke,
               (long)(local_258 * 1000.0 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9,0);
  }
  local_378._M_allocated_capacity = 0;
  local_378._8_8_ = (void *)0x0;
  local_368 = 0;
  local_3b9 = '\0';
  local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3ba = 0;
  local_2c8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2c8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmProcessOutput::cmProcessOutput(&local_3bb,encoding,0x400);
  local_270.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_3a8._8_8_
  ;
  local_270.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8;
  local_260 = &local_3bb;
  uVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_3b8);
  RunCommand::anon_class_24_3_169f6e42::operator()
            ((anon_class_24_3_169f6e42 *)local_3a8,&local_270,(int)&local_2b8,
             (vector<char,_std::allocator<char>_> *)(ulong)uVar5,(bool *)local_378._M_local_buf);
  uVar5 = cmUVProcessChain::ErrorStream((cmUVProcessChain *)local_3b8);
  RunCommand::anon_class_24_3_169f6e42::operator()
            ((anon_class_24_3_169f6e42 *)local_3b0,&local_270,(int)&local_2c8,
             (vector<char,_std::allocator<char>_> *)(ulong)uVar5,(bool *)(local_3a8 + 0x10));
  while ((local_3b9 != '\x01' || ((local_3ba & 1) == 0))) {
    puVar8 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_3b8);
    uv_run(puVar8,UV_RUN_ONCE);
  }
  if (((((_Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_> *)
        &(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3a8._8_8_)->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->
       super__Head_base<0UL,_cmCTest::Private_*,_false>)._M_head_impl)->ExtraVerbose != false) {
    local_1a8._8_8_ = 0;
    local_1a8[0x10] = '\0';
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_1a8._0_8_ = local_1a8 + 0x10;
    cmProcessOutput::DecodeText(&local_3bb,&local_228,(string *)local_1a8,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    if (local_1a8._8_8_ != 0) {
      cmSystemTools::Stdout((string *)local_1a8);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
  }
  while (bVar4 = cmUVProcessChain::Finished((cmUVProcessChain *)local_3b8), !bVar4) {
    puVar8 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_3b8);
    uv_run(puVar8,UV_RUN_ONCE);
  }
  if (local_378._M_allocated_capacity != local_378._8_8_) {
    uVar9 = local_378._8_8_ - local_378._0_8_;
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar9 < 0) goto LAB_002582f7;
    pcVar10 = (pointer)operator_new(uVar9);
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar10 + uVar9;
    sVar7 = local_378._8_8_ - local_378._0_8_;
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar10;
    if (sVar7 != 0) {
      local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar10;
      memmove(pcVar10,(void *)local_378._M_allocated_capacity,sVar7);
    }
    local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar10 + sVar7;
    cmProcessOutput::DecodeText
              (&local_3bb,&local_338,(vector<char,_std::allocator<char>_> *)&local_378,0);
    if (local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append((char *)psVar2,local_378._M_allocated_capacity);
  }
  if (local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar9 = (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar9 < 0) {
LAB_002582f7:
      std::__throw_bad_alloc();
    }
    pcVar10 = (pointer)operator_new(uVar9);
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar10 + uVar9;
    sVar7 = (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar10;
    if (sVar7 != 0) {
      local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar10;
      memmove(pcVar10,local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar7);
    }
    local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar10 + sVar7;
    cmProcessOutput::DecodeText
              (&local_3bb,&local_358,(vector<char,_std::allocator<char>_> *)(local_3a8 + 0x10),0);
    if (local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append
              ((char *)psVar3,
               (ulong)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  this_00 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_3b8,0);
  cmUVProcessChain::Status::GetException_abi_cxx11_(&local_320,this_00);
  if (local_320.first == None) {
    if (local_2a8 == (int *)0x0) {
      bVar4 = this_00->ExitStatus == 0;
    }
    else {
      *local_2a8 = (int)this_00->ExitStatus;
      bVar4 = true;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_320.second._M_dataplus._M_p,
                         local_320.second._M_string_length);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log((cmCTest *)local_3a8._8_8_,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xe25,(char *)local_248,false);
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_320.second._M_dataplus._M_p);
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.second._M_dataplus._M_p != &local_320.second.field_2) {
    operator_delete(local_320.second._M_dataplus._M_p,
                    local_320.second.field_2._M_allocated_capacity + 1);
  }
  if ((StdioConfiguration)local_3b0 != (StdioConfiguration)0x0) {
    std::default_delete<cmUVStreamReadHandle>::operator()
              ((default_delete<cmUVStreamReadHandle> *)local_3b0,(cmUVStreamReadHandle *)local_3b0);
  }
  if ((StdioConfiguration)local_3a8._0_8_ != (StdioConfiguration)0x0) {
    std::default_delete<cmUVStreamReadHandle>::operator()
              ((default_delete<cmUVStreamReadHandle> *)local_3a8,
               (cmUVStreamReadHandle *)local_3a8._0_8_);
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_2c8);
  if ((cmProcessOutput *)
      local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (cmProcessOutput *)0x0) {
    operator_delete(local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_2b8);
  if ((void *)local_378._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_378._M_allocated_capacity,local_368 - local_378._0_8_);
  }
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_2f8);
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.WorkingDirectory._M_dataplus._M_p != &local_208.WorkingDirectory.field_2) {
    operator_delete(local_208.WorkingDirectory._M_dataplus._M_p,
                    local_208.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_208.Processes);
  if (local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmUVProcessChainBuilder builder;
  builder.AddCommand(args)
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();

  cm::uv_timer_ptr timer;
  bool timedOut = false;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempOutput;
  bool outFinished = false;
  cm::uv_pipe_ptr outStream;
  std::vector<char> tempError;
  bool errFinished = false;
  cm::uv_pipe_ptr errStream;
  cmProcessOutput processOutput(encoding);
  auto startRead = [this, &chain, &processOutput](
                     cm::uv_pipe_ptr& pipe, int stream,
                     std::vector<char>& temp,
                     bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
    pipe.init(chain.GetLoop(), 0);
    uv_pipe_open(pipe, stream);
    return cmUVStreamRead(
      pipe,
      [this, &temp, &processOutput](std::vector<char> data) {
        cm::append(temp, data);
        if (this->Impl->ExtraVerbose) {
          std::string strdata;
          processOutput.DecodeText(data.data(), data.size(), strdata);
          cmSystemTools::Stdout(strdata);
        }
      },
      [&finished]() { finished = true; });
  };
  auto outputHandle =
    startRead(outStream, chain.OutputStream(), tempOutput, outFinished);
  auto errorHandle =
    startRead(errStream, chain.ErrorStream(), tempError, errFinished);
  while (!timedOut && !(outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  if (this->Impl->ExtraVerbose) {
    std::string strdata;
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  while (!timedOut && !chain.Finished()) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        cmCTestLog(this, ERROR_MESSAGE, exception.second << std::endl);
        stdErr->append(exception.second);
        result = false;
      } break;
    }
  }

  return result;
}